

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RedundantSetElimination.cpp
# Opt level: O0

int __thiscall
wasm::anon_unknown_21::RedundantSetElimination::remove
          (RedundantSetElimination *this,char *__filename)

{
  Expression *pEVar1;
  bool bVar2;
  LocalSet *this_00;
  Drop *this_01;
  char *extraout_RAX;
  Drop *drop;
  Expression *value;
  LocalSet *set;
  Expression **item_local;
  RedundantSetElimination *this_local;
  
  this_00 = Expression::cast<wasm::LocalSet>(*(Expression **)__filename);
  pEVar1 = this_00->value;
  bVar2 = LocalSet::isTee(this_00);
  if (bVar2) {
    bVar2 = wasm::Type::operator!=
                      (&pEVar1->type,
                       &(this_00->super_SpecificExpression<(wasm::Expression::Id)9>).
                        super_Expression.type);
    if (bVar2) {
      this->refinalize = true;
    }
    *(Expression **)__filename = pEVar1;
  }
  else {
    this_01 = ExpressionManipulator::convert<wasm::LocalSet,wasm::Drop>(this_00);
    this_01->value = pEVar1;
    Drop::finalize(this_01);
    __filename = extraout_RAX;
  }
  return (int)__filename;
}

Assistant:

void remove(Expression** item) {
    auto* set = (*item)->cast<LocalSet>();
    auto* value = set->value;
    if (!set->isTee()) {
      auto* drop = ExpressionManipulator::convert<LocalSet, Drop>(set);
      drop->value = value;
      drop->finalize();
    } else {
      // If we are replacing the set with something of a more specific type,
      // then we need to refinalize, for example:
      //
      //  (struct.get $X 0
      //    (local.tee $x
      //      (..something of type $Y, a subtype of $X..)
      //    )
      //  )
      //
      // After the replacement the struct.get will read from $Y, whose field may
      // have a more refined type.
      if (value->type != set->type) {
        refinalize = true;
      }
      *item = value;
    }
  }